

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_get_stats(quicly_conn_t *conn,quicly_stats_t *stats)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  quicly_cc_t *pqVar5;
  quicly_cc_t *pqVar6;
  byte bVar7;
  
  bVar7 = 0;
  memcpy(stats,&(conn->super).stats,0x1d0);
  uVar1 = (conn->egress).loss.rtt.smoothed;
  uVar2 = (conn->egress).loss.rtt.variance;
  uVar3 = (conn->egress).loss.rtt.latest;
  (stats->rtt).minimum = (conn->egress).loss.rtt.minimum;
  (stats->rtt).smoothed = uVar1;
  (stats->rtt).variance = uVar2;
  (stats->rtt).latest = uVar3;
  pqVar5 = &(conn->egress).cc;
  pqVar6 = &stats->cc;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pqVar6->type = pqVar5->type;
    pqVar5 = (quicly_cc_t *)((long)pqVar5 + (ulong)bVar7 * -0x10 + 8);
    pqVar6 = (quicly_cc_t *)((long)pqVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  return 0;
}

Assistant:

int quicly_get_stats(quicly_conn_t *conn, quicly_stats_t *stats)
{
    /* copy the pre-built stats fields */
    memcpy(stats, &conn->super.stats, sizeof(conn->super.stats));

    /* set or generate the non-pre-built stats fields here */
    stats->rtt = conn->egress.loss.rtt;
    stats->cc = conn->egress.cc;
    return 0;
}